

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

bool __thiscall
docopt::Either::match
          (Either *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  pointer *this_00;
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  __normal_iterator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>_*,_std::vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>,_std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>_>_>_>
  __in;
  pointer psVar4;
  undefined1 local_88 [8];
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  c;
  PatternList l;
  vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>,_std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>_>_>
  outcomes;
  
  l.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar1 = (this->super_BranchPattern).fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &c.
             super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (psVar4 = (this->super_BranchPattern).fChildren.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)this_00,left);
    std::
    vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ::vector((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
              *)local_88,collected);
    peVar2 = (psVar4->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar3 = (*peVar2->_vptr_Pattern[2])
                      (peVar2,this_00,
                       (vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                        *)local_88);
    if ((char)iVar3 != '\0') {
      std::
      vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>,std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>>>
      ::
      emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>
                ((vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>,std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>>>
                  *)&l.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)this_00,
                 (vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                  *)local_88);
    }
    std::
    vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ::~vector((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
               *)local_88);
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)this_00);
  }
  __in = std::
         __min_element<__gnu_cxx::__normal_iterator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>*,std::vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>,std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<docopt::Either::match(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>&,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>&)const::_lambda(std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>const&,std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>const&)_1_>>
                   (l.
                    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  if (__in._M_current !=
      (pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
       *)0x0) {
    c.
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)collected;
    l.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)left;
    std::
    tuple<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>&,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>&>
    ::operator=((tuple<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>&,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>&>
                 *)&c.
                    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__in._M_current);
  }
  std::
  vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>,_std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>_>_>
  ::~vector((vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>,_std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>_>_>
             *)&l.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __in._M_current !=
         (pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
          *)0x0;
}

Assistant:

inline bool Either::match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const
	{
		using Outcome = std::pair<PatternList, std::vector<std::shared_ptr<LeafPattern>>>;

		std::vector<Outcome> outcomes;

		for(auto const& pattern : fChildren) {
			// need a copy so we apply the same one for every iteration
			auto l = left;
			auto c = collected;
			bool matched = pattern->match(l, c);
			if (matched) {
				outcomes.emplace_back(std::move(l), std::move(c));
			}
		}

		auto min = std::min_element(outcomes.begin(), outcomes.end(), [](Outcome const& o1, Outcome const& o2) {
			return o1.first.size() < o2.first.size();
		});

		if (min == outcomes.end()) {
			// (left, collected) unchanged
			return false;
		}

		std::tie(left, collected) = std::move(*min);
		return true;
	}